

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::swapItems(CGUIListBox *this,u32 index1,u32 index2)

{
  u32 uVar1;
  ListItem *pLVar2;
  uint in_EDX;
  uint in_ESI;
  ListItem dummmy;
  ListItem *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  
  uVar1 = core::array<irr::gui::CGUIListBox::ListItem>::size
                    ((array<irr::gui::CGUIListBox::ListItem> *)0x3c309f);
  if ((in_ESI < uVar1) &&
     (uVar1 = core::array<irr::gui::CGUIListBox::ListItem>::size
                        ((array<irr::gui::CGUIListBox::ListItem> *)0x3c30c2), in_EDX < uVar1)) {
    core::array<irr::gui::CGUIListBox::ListItem>::operator[]
              ((array<irr::gui::CGUIListBox::ListItem> *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),
               (u32)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    ListItem::ListItem((ListItem *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88);
    pLVar2 = core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                       ((array<irr::gui::CGUIListBox::ListItem> *)
                        CONCAT44(in_EDX,in_stack_ffffffffffffff90),
                        (u32)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    core::array<irr::gui::CGUIListBox::ListItem>::operator[]
              ((array<irr::gui::CGUIListBox::ListItem> *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),
               (u32)((ulong)pLVar2 >> 0x20));
    ListItem::operator=((ListItem *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),pLVar2);
    core::array<irr::gui::CGUIListBox::ListItem>::operator[]
              ((array<irr::gui::CGUIListBox::ListItem> *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),
               (u32)((ulong)pLVar2 >> 0x20));
    ListItem::operator=((ListItem *)CONCAT44(in_EDX,in_stack_ffffffffffffff90),pLVar2);
    ListItem::~ListItem((ListItem *)0x3c3159);
  }
  return;
}

Assistant:

void CGUIListBox::swapItems(u32 index1, u32 index2)
{
	if (index1 >= Items.size() || index2 >= Items.size())
		return;

	ListItem dummmy = Items[index1];
	Items[index1] = Items[index2];
	Items[index2] = dummmy;
}